

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O3

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  ulong __n;
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *__dest;
  void *pvVar4;
  undefined8 *__src;
  
  if (op != get_functor_type_tag) {
    switch(op) {
    case clone_functor_tag:
      puVar1 = (undefined8 *)in_buffer->obj_ptr;
      puVar3 = (undefined8 *)operator_new(0x20);
      __n = puVar1[2];
      puVar3[2] = __n;
      *puVar3 = 0;
      __src = puVar1;
      __dest = puVar3;
      if (0x10 < __n) {
        __dest = (undefined8 *)operator_new__(__n);
        *puVar3 = __dest;
        __src = (undefined8 *)*puVar1;
      }
      memcpy(__dest,__src,__n);
      *(undefined4 *)(puVar3 + 3) = *(undefined4 *)(puVar1 + 3);
      out_buffer->obj_ptr = puVar3;
      break;
    case move_functor_tag:
      out_buffer->obj_ptr = in_buffer->obj_ptr;
      in_buffer->obj_ptr = (void *)0x0;
      break;
    case destroy_functor_tag:
      puVar1 = (undefined8 *)out_buffer->obj_ptr;
      if (((puVar1 != (undefined8 *)0x0) && (0x10 < (ulong)puVar1[2])) &&
         ((void *)*puVar1 != (void *)0x0)) {
        operator_delete__((void *)*puVar1);
      }
      operator_delete(puVar1);
      out_buffer->obj_ptr = (void *)0x0;
      break;
    case check_functor_type_tag:
      iVar2 = strcmp(*(char **)(out_buffer->func_ptr + 8) +
                     (**(char **)(out_buffer->func_ptr + 8) == '*'),
                     "N5boost9algorithm6detail13token_finderFINS1_10is_any_ofFIcEEEE");
      if (iVar2 == 0) {
        pvVar4 = in_buffer->obj_ptr;
      }
      else {
        pvVar4 = (void *)0x0;
      }
      out_buffer->obj_ptr = pvVar4;
      break;
    default:
      out_buffer->obj_ptr =
           &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
      *(bool *)((long)out_buffer + 8) = false;
      *(bool *)((long)out_buffer + 9) = false;
    }
    return;
  }
  out_buffer->obj_ptr =
       &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
  *(bool *)((long)out_buffer + 8) = false;
  *(bool *)((long)out_buffer + 9) = false;
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer, 
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.type.type = &BOOST_SP_TYPEID(functor_type);
            out_buffer.type.const_qualified = false;
            out_buffer.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }